

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_poll_impl.cc
# Opt level: O1

void __thiscall iqnet::Reactor_poll_impl::reset(Reactor_poll_impl *this,HandlerStateList *in)

{
  ushort uVar1;
  Impl *pIVar2;
  pointer ppVar3;
  _List_node_base *p_Var4;
  vector<pollfd,std::allocator<pollfd>> *this_00;
  iterator __position;
  pollfd sfd;
  pollfd local_28;
  
  pIVar2 = this->impl;
  ppVar3 = (pIVar2->pfd).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pIVar2->pfd).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar3) {
    (pIVar2->pfd).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar3;
  }
  for (p_Var4 = (in->
                super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                )._M_impl._M_node.super__List_node_base._M_next; p_Var4 != (_List_node_base *)in;
      p_Var4 = (((_List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                  *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    uVar1 = *(ushort *)((long)&p_Var4[1]._M_next + 4);
    local_28.events = (uVar1 & 1) + (uVar1 & 2) * 2;
    local_28.fd = *(undefined4 *)&p_Var4[1]._M_next;
    local_28.revents = 0;
    this_00 = (vector<pollfd,std::allocator<pollfd>> *)this->impl;
    __position._M_current = *(pollfd **)(this_00 + 8);
    if (__position._M_current == *(pollfd **)(this_00 + 0x10)) {
      std::vector<pollfd,std::allocator<pollfd>>::_M_realloc_insert<pollfd_const&>
                (this_00,__position,&local_28);
    }
    else {
      *__position._M_current = local_28;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
    }
  }
  return;
}

Assistant:

void Reactor_poll_impl::reset(const HandlerStateList& in)
{
  impl->pfd.clear();

  for( HandlerStateList::const_iterator i = in.begin(); i != in.end(); ++i )
  {
    short events = i->mask & Reactor_base::INPUT ? POLLIN : 0;
    events |= i->mask & Reactor_base::OUTPUT ? POLLOUT : 0;
    struct pollfd sfd = { i->fd, events, 0 };
    impl->pfd.push_back( sfd );
  }
}